

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

void uv__fs_scandir_cleanup(uv_fs_t *req)

{
  uint uVar1;
  uint uVar2;
  void *__ptr;
  
  uVar2 = req->nbufs;
  uVar1 = (uint)req->result;
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else if (uVar2 != uVar1) {
    uVar2 = uVar2 - 1;
    req->nbufs = uVar2;
  }
  __ptr = req->ptr;
  if (uVar2 < uVar1) {
    do {
      free(*(void **)((long)__ptr + (ulong)uVar2 * 8));
      uVar2 = req->nbufs + 1;
      req->nbufs = uVar2;
    } while (uVar2 < (uint)req->result);
    __ptr = req->ptr;
  }
  free(__ptr);
  req->ptr = (void *)0x0;
  return;
}

Assistant:

void uv__fs_scandir_cleanup(uv_fs_t* req) {
  uv__dirent_t** dents;

  unsigned int* nbufs = uv__get_nbufs(req);

  dents = req->ptr;
  if (*nbufs > 0 && *nbufs != (unsigned int) req->result)
    (*nbufs)--;
  for (; *nbufs < (unsigned int) req->result; (*nbufs)++)
    uv__fs_scandir_free(dents[*nbufs]);

  uv__fs_scandir_free(req->ptr);
  req->ptr = NULL;
}